

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniply.cpp
# Opt level: O3

bool __thiscall
miniply::PLYReader::load_ascii_scalar_property(PLYReader *this,PLYProperty *prop,size_t *destIndex)

{
  uint uVar1;
  bool bVar2;
  uint8_t value [8];
  uint8_t auStack_28 [8];
  
  bVar2 = ascii_value(this,prop->type,auStack_28);
  if (bVar2) {
    uVar1 = *(uint *)(kPLYPropertySize + (ulong)prop->type * 4);
    memcpy((this->m_elementData).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start + *destIndex,auStack_28,(ulong)uVar1);
    *destIndex = *destIndex + (ulong)uVar1;
  }
  return bVar2;
}

Assistant:

bool PLYReader::load_ascii_scalar_property(PLYProperty& prop, size_t& destIndex)
  {
    uint8_t value[8];
    if (!ascii_value(prop.type, value)) {
      return false;
    }

    size_t numBytes = kPLYPropertySize[uint32_t(prop.type)];
    std::memcpy(m_elementData.data() + destIndex, value, numBytes);
    destIndex += numBytes;
    return true;
  }